

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int32_t container_write(container_t *c,uint8_t typecode,char *buf)

{
  char *buf_local;
  array_container_t *paStack_18;
  uint8_t typecode_local;
  container_t *c_local;
  
  buf_local._7_1_ = typecode;
  paStack_18 = (array_container_t *)c;
  paStack_18 = (array_container_t *)container_unwrap_shared(c,(uint8_t *)((long)&buf_local + 7));
  if (buf_local._7_1_ == '\x01') {
    c_local._4_4_ = bitset_container_write((bitset_container_t *)paStack_18,buf);
  }
  else if (buf_local._7_1_ == '\x02') {
    c_local._4_4_ = array_container_write(paStack_18,buf);
  }
  else {
    if (buf_local._7_1_ != '\x03') {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x118f,"int32_t container_write(const container_t *, uint8_t, char *)");
    }
    c_local._4_4_ = run_container_write((run_container_t *)paStack_18,buf);
  }
  return c_local._4_4_;
}

Assistant:

static inline int32_t container_write(
    const container_t *c, uint8_t typecode,
    char *buf
){
    c = container_unwrap_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_write(const_CAST_bitset(c), buf);
        case ARRAY_CONTAINER_TYPE:
            return array_container_write(const_CAST_array(c), buf);
        case RUN_CONTAINER_TYPE:
            return run_container_write(const_CAST_run(c), buf);
    }
    assert(false);
    __builtin_unreachable();
    return 0;  // unreached
}